

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O0

void delete_denoted_object(Denoted_Object *object)

{
  Denoted_Object *object_local;
  
  if (object->id != (token *)0x0) {
    free(object->id);
  }
  if (object->object != (Object *)0x0) {
    delete_object(object->object);
  }
  if (object->initializer != (AST *)0x0) {
    delete_ast(object->initializer);
  }
  free(object);
  return;
}

Assistant:

void delete_denoted_object(struct Denoted_Object *object)
{
	if(object->id!=NULL)
		free(object->id);
	if(object->object!=NULL)
		delete_object(object->object);
	if(object->initializer!=NULL)
		delete_ast(object->initializer);
	free(object);
}